

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O1

void add_separation_step<InputData<float,long>,WorkerMemory<ImputedData<long,long_double>,long_double,float>>
               (WorkerMemory<ImputedData<long,_long_double>,_long_double,_float> *workspace,
               InputData<float,_long> *input_data,double remainder)

{
  double *weights;
  size_t *ix_arr;
  double *counter;
  
  if (workspace->changed_weights == false) {
    increase_comb_counter
              ((workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start,workspace->st,workspace->end,
               input_data->nrows,
               (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,remainder);
    return;
  }
  weights = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  ix_arr = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  counter = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (weights !=
      (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    increase_comb_counter
              (ix_arr,workspace->st,workspace->end,input_data->nrows,counter,weights,remainder);
    return;
  }
  increase_comb_counter
            (ix_arr,workspace->st,workspace->end,input_data->nrows,counter,&workspace->weights_map,
             remainder);
  return;
}

Assistant:

void add_separation_step(WorkerMemory &workspace, InputData &input_data, double remainder)
{
    if (!workspace.changed_weights)
        increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                              input_data.nrows, workspace.tmat_sep.data(), remainder);
    else if (!workspace.weights_arr.empty())
        increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                              input_data.nrows, workspace.tmat_sep.data(), workspace.weights_arr.data(), remainder);
    else
        increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                              input_data.nrows, workspace.tmat_sep.data(), workspace.weights_map, remainder);
}